

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::setup4x4Viewport(DrawTestBase *this,VIEWPORT_METHOD method)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  uint local_150;
  GLuint i_1;
  GLfloat h;
  GLfloat w;
  GLfloat y_1;
  GLfloat x_1;
  GLuint i;
  GLuint x;
  GLuint y;
  GLfloat height;
  GLfloat width;
  GLfloat data [64];
  GLint index;
  Functions *gl;
  VIEWPORT_METHOD method_local;
  DrawTestBase *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  data[0x3f] = 0.0;
  for (i = 0; i < 4; i = i + 1) {
    for (x_1 = 0.0; (uint)x_1 < 4; x_1 = (GLfloat)((int)x_1 + 1)) {
      (&height)[(int)data[0x3f] << 2] = (float)(uint)x_1 * 32.0;
      (&height)[(int)data[0x3f] * 4 + 1] = (float)i * 32.0;
      (&height)[(int)data[0x3f] * 4 + 2] = 32.0;
      (&height)[(int)data[0x3f] * 4 + 3] = 32.0;
      data[0x3f] = (GLfloat)((int)data[0x3f] + 1);
    }
  }
  if (method == VIEWPORTARRAYV) {
    (**(code **)(lVar4 + 0x1a08))(0,0x10,&height);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc96);
  }
  else if (method == VIEWPORTINDEXEDF) {
    for (y_1 = 0.0; (uint)y_1 < 0x10; y_1 = (GLfloat)((int)y_1 + 1)) {
      (**(code **)(lVar4 + 0x1a10))
                ((&height)[(uint)((int)y_1 << 2)],(&height)[(int)y_1 * 4 + 1],
                 (&height)[(int)y_1 * 4 + 2],(&height)[(int)y_1 * 4 + 3],y_1);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"ViewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xca1);
    }
  }
  else {
    if (method != VIEWPORTINDEXEDF_V) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xcac);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (local_150 = 0; local_150 < 0x10; local_150 = local_150 + 1) {
      (**(code **)(lVar4 + 0x1a18))(local_150,&height + (local_150 << 2));
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"ViewportIndexedfv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xca8);
    }
  }
  return;
}

Assistant:

void DrawTestBase::setup4x4Viewport(VIEWPORT_METHOD method)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint   index = 0;
	GLfloat data[16 * 4 /* 4x4 * (x + y + w + h) */];

	GLfloat width  = (GLfloat)(m_width / 4);
	GLfloat height = (GLfloat)(m_height / 4);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			data[index * 4 + 0] = (GLfloat)((GLfloat)x * width);
			data[index * 4 + 1] = (GLfloat)((GLfloat)y * height);
			data[index * 4 + 2] = width;
			data[index * 4 + 3] = height;

			index += 1;
		}
	}

	switch (method)
	{
	case VIEWPORTARRAYV:
		gl.viewportArrayv(0 /* first */, 16 /*count */, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");
		break;
	case VIEWPORTINDEXEDF:
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLfloat x = data[i * 4 + 0];
			const GLfloat y = data[i * 4 + 1];
			const GLfloat w = data[i * 4 + 2];
			const GLfloat h = data[i * 4 + 3];

			gl.viewportIndexedf(i, x, y, w, h);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");
		}
		break;
	case VIEWPORTINDEXEDF_V:
		for (GLuint i = 0; i < 16; ++i)
		{
			gl.viewportIndexedfv(i, &data[i * 4]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");
		}
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}